

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O2

bool __thiscall CAPSFile::DecodeData(CAPSFile *this,DataChunks item,IDisk *disk)

{
  StreamItem SVar1;
  StreamItem SVar2;
  uchar *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  pointer paVar10;
  byte *pbVar11;
  ulong uVar12;
  MFMTrack **ppMVar13;
  uint c_1;
  int iVar14;
  int iVar15;
  ulong uVar16;
  byte bVar17;
  uint in_R9D;
  uint uVar18;
  long lVar19;
  int c;
  int iVar20;
  uint unaff_R14D;
  long lVar21;
  bool bVar22;
  int local_ac;
  uint local_a8;
  StreamItem backward_stream;
  StreamItem forward_stream;
  char local_7c;
  byte local_78;
  uint local_6c;
  undefined4 local_64;
  CAPSFile *local_60;
  uchar *local_58;
  uint local_4c;
  uchar *local_48;
  uchar *local_40;
  byte *local_38;
  
  if (item.size != 0) {
    paVar10 = (this->list_imge_).
              super__Vector_base<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>._M_impl.
              super__Vector_impl_data._M_start;
    bVar22 = false;
    while ((paVar10 !=
            (this->list_imge_).
            super__Vector_base<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>._M_impl.
            super__Vector_impl_data._M_finish && (!bVar22))) {
      bVar22 = paVar10->data_key == item.data_id;
      if (bVar22) {
        local_a8 = paVar10->track_number;
        local_ac = paVar10->side;
        unaff_R14D = paVar10->start_bit_pos;
        in_R9D = paVar10->block_count;
      }
      paVar10 = paVar10 + 1;
    }
    if (!(bool)(bVar22 & in_R9D << 5 <= item.size)) {
      return false;
    }
    local_48 = item.buffer;
    ppMVar13 = &disk->side_[local_ac].tracks;
    lVar21 = (long)(int)local_a8;
    local_6c = 0;
    local_60 = this;
    local_4c = in_R9D;
    for (uVar18 = 0; puVar3 = local_48, uVar18 != local_4c; uVar18 = uVar18 + 1) {
      uVar12 = (ulong)local_6c;
      uVar4 = ExtractInt(local_48 + uVar12 + 4);
      if (local_60->encoder_type_ == 1) {
        uVar16 = 0;
      }
      else {
        uVar5 = ExtractInt(puVar3 + uVar12 + 8);
        uVar16 = (ulong)uVar5;
      }
      uVar5 = ExtractInt(puVar3 + uVar12 + 0x14);
      uVar6 = ExtractInt(puVar3 + uVar12 + 0x18);
      uVar7 = ExtractInt(puVar3 + uVar12 + 0x1c);
      local_64 = 0;
      backward_stream.size = 0;
      backward_stream.sample_size = '\0';
      backward_stream.sample = '\0';
      backward_stream._6_2_ = 0;
      forward_stream.size = 0;
      forward_stream.sample_size = '\0';
      forward_stream.sample = '\0';
      forward_stream._6_2_ = 0;
      if ((uVar5 & 1) == 0) {
        local_7c = '\0';
      }
      else {
        iVar20 = (*local_60->_vptr_CAPSFile[8])
                           (local_60,&forward_stream,puVar3 + uVar16,&local_64,(ulong)item.size);
        local_7c = (char)iVar20;
      }
      if ((uVar5 & 2) == 0) {
        local_78 = 0;
      }
      else {
        iVar20 = (*local_60->_vptr_CAPSFile[8])
                           (local_60,&backward_stream,puVar3 + uVar16,&local_64,(ulong)item.size);
        local_78 = (byte)iVar20;
      }
      local_6c = local_6c + 0x20;
      pbVar11 = local_48 + (int)uVar7;
      local_40 = local_48 + (int)uVar7;
      iVar20 = 1;
      local_38 = pbVar11;
      while( true ) {
        iVar15 = 0;
        bVar17 = *pbVar11;
        if (bVar17 == 0) break;
        pbVar11 = local_40 + iVar20;
        iVar9 = (uint)(bVar17 >> 5) * 8;
        iVar14 = 0;
        while (iVar9 = iVar9 + -8, iVar9 != -8) {
          iVar14 = iVar14 + ((uint)*pbVar11 << ((byte)iVar9 & 0x1f));
          pbVar11 = pbVar11 + 1;
        }
        uVar7 = bVar17 & 0x1f;
        iVar9 = iVar20 + (uint)(bVar17 >> 5);
        if ((uVar5 & 4) == 0) {
          if (uVar7 == 5) {
            for (iVar20 = 0; SBORROW4(iVar20,iVar14 * 0x10) != iVar20 + iVar14 * -0x10 < 0;
                iVar20 = iVar20 + 1) {
              if ((iVar20 < 0x1001) && (iVar14 == 0x200)) {
                unaff_R14D = IDisk::AddByteToSpecificTrack
                                       (disk,local_ac,local_a8,unaff_R14D,0xe5,0x10);
                iVar20 = iVar20 + 0xf;
              }
              else {
                uVar12 = (ulong)unaff_R14D;
                unaff_R14D = unaff_R14D + 1;
                (*ppMVar13)[lVar21].bitfield[uVar12] = '\x04';
                if ((*ppMVar13)[lVar21].size <= unaff_R14D) {
                  unaff_R14D = 0;
                }
              }
            }
          }
          else {
            if (iVar14 < 1) {
              iVar14 = iVar15;
            }
            local_58 = local_40 + iVar9;
            for (lVar19 = 0; iVar14 != (int)lVar19; lVar19 = lVar19 + 1) {
              if (uVar7 == 1) {
                unaff_R14D = IDisk::AddMFMByteToAllTrack
                                       (disk,local_ac,local_a8,unaff_R14D,local_58[lVar19],8);
              }
              else {
                unaff_R14D = IDisk::AddByteToSpecificTrack
                                       (disk,local_ac,local_a8,unaff_R14D,local_58[lVar19],0x10);
              }
            }
            iVar9 = iVar9 + (int)lVar19;
          }
        }
        else {
          while (iVar14 != 0) {
            if (uVar7 == 5) {
              if (iVar14 < 1) {
                iVar14 = iVar15;
              }
              while (bVar22 = iVar14 != 0, iVar14 = iVar14 + -1, bVar22) {
                uVar12 = (ulong)unaff_R14D;
                unaff_R14D = unaff_R14D + 1;
                (*ppMVar13)[lVar21].bitfield[uVar12] = '\x04';
                if ((*ppMVar13)[lVar21].size <= unaff_R14D) {
                  unaff_R14D = 0;
                }
              }
              iVar14 = 0;
            }
            else {
              iVar20 = iVar9 + 1;
              bVar17 = local_38[iVar9];
              iVar9 = iVar20;
              if (uVar7 == 1) {
                if (iVar14 < 9) {
                  if (iVar14 < 1) {
                    iVar14 = iVar15;
                  }
                  for (uVar8 = 7; uVar8 + iVar14 != 7; uVar8 = uVar8 - 1) {
                    (*ppMVar13)[lVar21].bitfield[unaff_R14D] = (bVar17 >> (uVar8 & 0x1f) & 1) != 0;
                    unaff_R14D = unaff_R14D + 1;
                    if ((*ppMVar13)[lVar21].size <= unaff_R14D) {
                      unaff_R14D = 0;
                    }
                  }
                  iVar14 = 0;
                }
                else {
                  for (uVar8 = 7; uVar8 != 0xffffffff; uVar8 = uVar8 - 1) {
                    (*ppMVar13)[lVar21].bitfield[unaff_R14D] = (bVar17 >> (uVar8 & 0x1f) & 1) != 0;
                    unaff_R14D = unaff_R14D + 1;
                    if ((*ppMVar13)[lVar21].size <= unaff_R14D) {
                      unaff_R14D = 0;
                    }
                  }
                  iVar14 = iVar14 + -8;
                }
              }
              else {
                local_58 = (uchar *)CONCAT44(local_58._4_4_,uVar7);
                if (iVar14 < 8) {
                  unaff_R14D = IDisk::AddByteToSpecificTrack
                                         (disk,local_ac,local_a8,unaff_R14D,bVar17,iVar14 * 2);
                  iVar14 = 0;
                }
                else {
                  unaff_R14D = IDisk::AddByteToSpecificTrack
                                         (disk,local_ac,local_a8,unaff_R14D,bVar17,0x10);
                  iVar14 = iVar14 + -8;
                }
                uVar7 = (uint)local_58;
              }
            }
          }
        }
        iVar20 = iVar9 + 1;
        pbVar11 = local_38 + iVar9;
      }
      if (local_60->encoder_type_ == 1) {
        uVar5 = 0;
        while (uVar7 = uVar4 - uVar5, uVar5 <= uVar4 && uVar7 != 0) {
          uVar8 = uVar4;
          if (0xf < uVar7) {
            uVar7 = 0x10;
            uVar8 = uVar5;
          }
          unaff_R14D = IDisk::AddByteToSpecificTrack
                                 (disk,local_ac,local_a8,unaff_R14D,(uchar)uVar6,uVar7);
          uVar5 = uVar8 + 0x10;
        }
      }
      else {
        uVar7 = forward_stream.size * 2 + backward_stream.size * 2;
        uVar5 = backward_stream.size;
        if (uVar4 < uVar7) {
LAB_0015874e:
          forward_stream.size = uVar4 + backward_stream.size * -2 >> 1;
          uVar8 = forward_stream.size;
        }
        else {
          uVar8 = forward_stream.size;
          if (uVar7 < uVar4) {
            bVar17 = backward_stream.size == 0 & local_78;
            if (local_7c == '\x01' && forward_stream.size == 0) {
              if (bVar17 == 0) goto LAB_0015874e;
              forward_stream.size = uVar4 >> 2;
              uVar8 = uVar4 >> 2;
            }
            else if (bVar17 == 0) goto LAB_001587a8;
            uVar5 = uVar4 + uVar8 * -2 >> 1;
            backward_stream.size = uVar5;
          }
        }
LAB_001587a8:
        SVar1 = backward_stream;
        if (local_7c != '\0') {
          if (uVar8 == 0) {
            if (uVar5 == 0) {
              uVar8 = uVar4 >> 2;
              backward_stream.size = uVar8;
              SVar2 = backward_stream;
              forward_stream.size = uVar8;
              backward_stream._6_2_ = SVar1._6_2_;
              backward_stream._0_5_ = SVar2._0_5_;
              backward_stream.sample = (uchar)uVar6;
            }
            else {
              uVar8 = (uVar4 >> 1) - uVar5;
              forward_stream.size = uVar8;
            }
          }
          for (uVar5 = 0; uVar6 = uVar8 * 2 - uVar5, uVar5 <= uVar8 * 2 && uVar6 != 0;
              uVar5 = uVar5 + 0x10) {
            if (uVar6 < 0x10) {
              unaff_R14D = IDisk::AddByteToSpecificTrack
                                     (disk,local_ac,local_a8,unaff_R14D,forward_stream.sample,uVar6)
              ;
              uVar5 = forward_stream.size * 2;
              uVar8 = forward_stream.size;
            }
            else if (forward_stream.sample_size == '\b') {
              unaff_R14D = IDisk::AddByteToSpecificTrack
                                     (disk,local_ac,local_a8,unaff_R14D,forward_stream.sample,0x10);
              uVar8 = forward_stream.size;
            }
          }
          uVar5 = backward_stream.size;
        }
        iVar20 = uVar4 + (uVar5 + uVar8) * -2;
        if ((uVar5 + uVar8) * 2 <= uVar4 && iVar20 != 0) {
          iVar15 = 0;
          iVar9 = 0x10;
          while( true ) {
            iVar14 = iVar20;
            if (iVar9 < iVar20) {
              iVar14 = iVar9;
            }
            if (iVar20 <= iVar9 + -0x10) break;
            unaff_R14D = IDisk::AddByteToSpecificTrack
                                   (disk,local_ac,local_a8,unaff_R14D,'N',iVar14 + iVar15);
            iVar9 = iVar9 + 0x10;
            iVar15 = iVar15 + -0x10;
          }
        }
        if (local_78 != 0) {
          uVar4 = backward_stream.size & 7;
          if (((ulong)backward_stream & 7) != 0) {
            unaff_R14D = IDisk::AddByteToSpecificTrack
                                   (disk,local_ac,local_a8,unaff_R14D,backward_stream.sample,uVar4);
          }
          while( true ) {
            uVar5 = backward_stream.size * 2 - uVar4;
            if (backward_stream.size * 2 < uVar4 || uVar5 == 0) break;
            if (uVar5 < 0x10) {
              unaff_R14D = IDisk::AddByteToSpecificTrack
                                     (disk,local_ac,local_a8,unaff_R14D,backward_stream.sample,uVar5
                                     );
              uVar4 = backward_stream.size * 2;
            }
            else if (backward_stream.sample_size == '\b') {
              unaff_R14D = IDisk::AddByteToSpecificTrack
                                     (disk,local_ac,local_a8,unaff_R14D,backward_stream.sample,0x10)
              ;
            }
            uVar4 = uVar4 + 0x10;
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool CAPSFile::DecodeData(DataChunks item, IDisk* disk)
{
   unsigned int offset = 0;
   unsigned char* block = item.buffer;
   unsigned char* data_block = &block[offset];

   int total_total = 0;
   // Now, extra data blocks ?
   if (item.size != 0)
   {
      // Get block count from IMGE
      ImgeItem imge_item;
      bool found = false;
      for (std::vector<ImgeItem>::iterator it = list_imge_.begin(); it != list_imge_.end() && (!found); it++)
      {
         if (it->data_key == item.data_id)
         {
            // Found !
            imge_item = *it;
            found = true;
         }
      }
      if (!found || (imge_item.block_count * 32 > item.size))
      {
         // Error !
         return false;
         // TODO : Save this chunk for later use ?
         //break;
      }
      else
      {
         int total_data = 0;

         unsigned int index_track = imge_item.start_bit_pos;
         for (DWORD i = 0; i < imge_item.block_count; i++)
         {
            // Read descriptors
            int data_bits = ExtractInt(&block[offset]);
            offset += 4;
            unsigned int gap_bits = ExtractInt(&block[offset]);
            offset += 4;
            int data_bytes = 0;
            int gap_bytes = 0;
            unsigned int gap_offset = 0;
            int cell_type = 0;
            if (encoder_type_ == 1)
            {
               data_bytes = ExtractInt(&block[offset]);
               offset += 4;
               gap_bytes = ExtractInt(&block[offset]);
               offset += 4;
            }
            else
            {
               gap_offset = ExtractInt(&block[offset]);
               offset += 4;
               cell_type = ExtractInt(&block[offset]);
               offset += 4;
            }
            int encoder_type = ExtractInt(&block[offset]);
            offset += 4;
            int block_flags = ExtractInt(&block[offset]);
            offset += 4;
            int gap_default = ExtractInt(&block[offset]);
            offset += 4;
            int data_offset = ExtractInt(&block[offset]);
            offset += 4;

            // Now, remaining datas
            unsigned char* current_block_gap = &data_block[gap_offset];
            unsigned char* current_block_data = &data_block[data_offset];
            data_offset = 0;
            gap_offset = 0;
            // Do we have backward gap ?
            // Read Forward / Backward streams
            StreamItem backward_stream = {0};
            StreamItem forward_stream = {0};

            unsigned int total_gap = 0;
            bool forward_gap = false;
            bool backward_gap = false;
            if ((block_flags & 0x1) == 0x1)
            {
               // Ok, Forward stream
               forward_gap = GetStreamGapItem(&forward_stream, current_block_gap, gap_offset, item.size);
            }
            if ((block_flags & 0x2) == 0x2)
            {
               // Ok, backward stream
               backward_gap = GetStreamGapItem(&backward_stream, current_block_gap, gap_offset, item.size);
            }

            // data
            unsigned char b = current_block_data[data_offset++];
            unsigned int offset_before = index_track;
            while (b != 0)
            {
               int size_width = b >> 5;
               int data_type = b & 0x1F;
               int data_size = 0;
               for (int j = 0; j < size_width; j++)
               {
                  data_size += (current_block_data[data_offset++] << (8 * (size_width - (j + 1))));
               }
               if ((block_flags & 0x4) == 0x4)
               {
                  // in bits
                  while (data_size != 0)
                  {
                     if (data_type == 5)
                     {
                        for (int c = 0; c < data_size; c++)
                        {
                           disk->side_[imge_item.side].tracks[imge_item.track_number].bitfield[index_track++] =
                              BIT_WEAK;
                           if (index_track >= disk->side_[imge_item.side].tracks[imge_item.track_number].size)
                              index_track = 0;
                        }
                        data_size = 0;
                     }
                     else
                     {
                        unsigned char bitfield = current_block_data[data_offset++];
                        if (data_type == 1)
                        {
                           if (data_size > 8)
                           {
                              int maxbits = 8;
                              for (int d = 0; d < 8; d++)
                              {
                                 maxbits--;
                                 int val = (bitfield >> maxbits) & 0x1;
                                 disk->side_[imge_item.side].tracks[imge_item.track_number].bitfield[index_track++] =
                                    val;
                                 if (index_track >= disk->side_[imge_item.side].tracks[imge_item.track_number].size)
                                    index_track = 0;
                              }
                              data_size -= 8;
                           }
                           else
                           {
                              int maxbits = 8;
                              for (int d = 0; d < data_size; d++)
                              {
                                 maxbits--;
                                 int val = (bitfield >> maxbits) & 0x1;
                                 disk->side_[imge_item.side].tracks[imge_item.track_number].bitfield[index_track++] =
                                    val;
                                 if (index_track >= disk->side_[imge_item.side].tracks[imge_item.track_number].size)
                                    index_track = 0;
                              }
                              data_size = 0;
                           }
                        }
                           // in bytes
                        else
                        {
                           // Convert to MFM
                           if (data_size >= 8)
                           {
                              index_track = disk->AddByteToSpecificTrack(
                                 imge_item.side, imge_item.track_number, index_track, bitfield);
                              data_size -= 8;
                           }
                           else
                           {
                              // Convert to MFM
                              index_track = disk->AddByteToSpecificTrack(
                                 imge_item.side, imge_item.track_number, index_track, bitfield, data_size * 2);
                              data_size -= data_size;
                           }
                        }
                     }
                  }
               }
               else
               {
                  // in bytes
                  if (data_type == 5)
                  {
                     // weak bit ??
                     unsigned char byte = 0xE5;

                     for (int c = 0; c < data_size * 16; c++)
                     {
                        if (c > 256 * 16 || data_size != 512)
                        {
                           disk->side_[imge_item.side].tracks[imge_item.track_number].bitfield[index_track++] =
                              BIT_WEAK;
                           if (index_track >= disk->side_[imge_item.side].tracks[imge_item.track_number].size)
                              index_track = 0;
                        }
                        else
                        {
                           index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number,
                                                                      index_track, byte);
                           c += 15;
                        }
                     }
                     //dataoffset++;
                  }
                  else
                  {
                     if (data_type == 3)
                     {
                        //totalGap += dataSize*16;
                     }
                     for (int c = 0; c < data_size; c++)
                     {
                        unsigned char byte = 0;
                        {
                           byte = current_block_data[data_offset++];

                           if (data_type == 1)
                           {
                              index_track = disk->AddMFMByteToAllTrack(imge_item.side, imge_item.track_number,
                                                                       index_track, byte, 8);
                           }
                           else
                           {
                              index_track = disk->AddByteToSpecificTrack(
                                 imge_item.side, imge_item.track_number, index_track, byte);
                           }
                        }
                     }
                  }
               }
               b = current_block_data[data_offset++];
            }
            if (offset_before > index_track)
            {
               offset_before = offset_before - disk->side_[imge_item.side].tracks[imge_item.track_number].size;
            }
            total_total += data_bits; //indexTrack - offsetBefore;
            total_data += data_bits;
            if ((data_bits != index_track - offset_before)
               && ((index_track != offset_before)
                  || (data_bits != disk->side_[imge_item.side].tracks[imge_item.track_number].size)
               )
            )
            {
               //
               int dbg = 1;
            }


            if (encoder_type_ == 1)
            {
               // GAP via CAPS encoding
               for (unsigned int c = 0; c < gap_bits; c += 16)
               {
                  if (gap_bits - c < 16)
                  {
                     // Add what we need to
                     index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number, index_track,
                                                                gap_default, (gap_bits - c));

                     // then quit
                     total_gap += gap_bits - c;
                     c = gap_bits;
                  }
                  else
                  {
                     {
                        index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number, index_track,
                                                                   gap_default);

                        if (index_track > imge_item.start_bit_pos && index_track < imge_item.start_bit_pos + 16)
                        {

                        }

                        total_gap += 16;
                     }
                  }
               }
            }
            else
            {
               if (forward_stream.size * 2 + backward_stream.size * 2 > gap_bits)
               {
                  // Remove from forward
                  forward_stream.size = (gap_bits - backward_stream.size * 2) / 2;
               }
               else
               {
                  if (forward_stream.size * 2 + backward_stream.size * 2 < gap_bits)
                  {
                     // Adjust :
                     //
                     if (forward_gap && forward_stream.size == 0)
                     {
                        if (backward_gap && backward_stream.size == 0)
                        {
                           forward_stream.size = gap_bits / 4;
                           backward_stream.size = (gap_bits - forward_stream.size * 2) / 2;
                        }
                        else
                        {
                           forward_stream.size = (gap_bits - backward_stream.size * 2) / 2;
                        }
                     }
                     else
                     {
                        if (backward_gap && backward_stream.size == 0)
                        {
                           backward_stream.size = (gap_bits - forward_stream.size * 2) / 2;
                        }
                     }
                  }
               }
               if (forward_gap)
               {
                  if (forward_stream.size == 0)
                  {
                     if (backward_stream.size != 0)
                     {
                        forward_stream.size = gap_bits / 2 - backward_stream.size;
                     }
                     else
                     {
                        forward_stream.size = backward_stream.size = gap_bits / 4;
                        backward_stream.sample = gap_default;
                     }
                     //forwardStream.Sample = gapDefault;
                  }
                  for (unsigned int c = 0; c < forward_stream.size * 2; c += 16)
                  {
                     if (forward_stream.size * 2 - c < 16)
                     {
                        // Add what we need to
                        index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number, index_track,
                                                                   forward_stream.sample,
                                                                   (forward_stream.size * 2 - c));

                        // then quit
                        total_gap += forward_stream.size * 2 - c;
                        c = forward_stream.size * 2;
                     }
                     else
                     {
                        if (forward_stream.sample_size == 8)
                        {
                           index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number,
                                                                      index_track, forward_stream.sample);

                           if (index_track > imge_item.start_bit_pos && index_track < imge_item.start_bit_pos + 16)
                           {
                           }

                           total_gap += 16;
                        }
                        else
                        {
                        }
                     }
                  }
               }
               // Between these two :
               {
                  if (forward_stream.size * 2 + backward_stream.size * 2 < gap_bits)
                  {
                     int nb_bytes = (gap_bits - (forward_stream.size * 2 + backward_stream.size * 2));
                     for (int gp = 0; gp < nb_bytes; gp += 16)
                     {
                        if (gp + 16 > nb_bytes)
                        {
                           // Add what we need to
                           index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number,
                                                                      index_track, 0x4E, (nb_bytes - gp));

                           // then quit
                           total_gap += nb_bytes - gp;
                        }
                        else
                        {
                           index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number,
                                                                      index_track, 0x4E);
                           total_gap += 16;
                        }

                        if (index_track > imge_item.start_bit_pos && index_track < imge_item.start_bit_pos + 16)
                        {
                        }
                     }
                  }
               }

               // Backward stream ?
               if (backward_gap)
               {
                  // First byte (or any part of it)
                  unsigned int c = 0;
                  if (backward_stream.size % 8 != 0)
                  {
                     // TODO
                     c = backward_stream.size % 8;
                     index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number, index_track,
                                                                backward_stream.sample, c);
                  }
                  for (; c < backward_stream.size * 2; c += 16)
                  {
                     if (backward_stream.size * 2 - c < 16)
                     {
                        // Add what we need to
                        index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number, index_track,
                                                                   backward_stream.sample,
                                                                   (backward_stream.size * 2 - c));

                        // then quit
                        total_gap += backward_stream.size * 2 - c;
                        c = backward_stream.size * 2;
                     }
                     else
                     {
                        if (backward_stream.sample_size == 8)
                        {
                           index_track = disk->AddByteToSpecificTrack(imge_item.side, imge_item.track_number,
                                                                      index_track, backward_stream.sample);

                           if (index_track > imge_item.start_bit_pos && index_track < imge_item.start_bit_pos + 16)
                           {
                           }

                           total_gap += 16;
                        }
                        else
                        {
                        }
                     }
                  }
               }
            }
            if (total_gap != gap_bits)
            {
            }
            //else
            total_total += total_gap;
         }

         // Check index / size
         if (index_track != imge_item.start_bit_pos || total_total != disk->side_[imge_item.side].tracks[imge_item.
            track_number].size)
         {
         }
      }
   }

   return true;
}